

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::attrItemStruct(GrpParser *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  AST *this_00;
  AST *other;
  AST *this_01;
  long *in_RDI;
  GrpParser *unaff_retaddr;
  ParserException *ex;
  RefAST tmp111_AST;
  RefAST tmp110_AST;
  RefAST tmp109_AST;
  RefAST X_AST;
  RefAST I_AST;
  RefAST attrItemStruct_AST;
  ASTPair currentAST;
  AST *in_stack_fffffffffffffe78;
  AST *in_stack_fffffffffffffe80;
  AST *in_stack_fffffffffffffe88;
  AST *in_stack_fffffffffffffe90;
  RefCount<AST> *in_stack_fffffffffffffe98;
  ASTArray *in_stack_fffffffffffffea0;
  RefToken *in_stack_fffffffffffffeb0;
  ASTFactory *in_stack_fffffffffffffeb8;
  Parser *in_stack_fffffffffffffec0;
  ASTPair *this_02;
  ASTArray *nodes;
  ASTFactory *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffef8;
  NoViableAltException *this_03;
  RefCount local_d8 [48];
  undefined1 local_a8 [31];
  undefined1 local_89;
  undefined1 local_88 [8];
  GrpParser *in_stack_ffffffffffffff80;
  undefined1 local_60 [8];
  undefined1 local_58 [56];
  RefCount<AST> local_20 [4];
  
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  ASTPair::ASTPair((ASTPair *)in_stack_fffffffffffffe90);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffe90->down,&in_stack_fffffffffffffe88->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffe90->down,&in_stack_fffffffffffffe88->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffe90->down,&in_stack_fffffffffffffe88->down);
  attrName(unaff_retaddr);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffe90->down,&in_stack_fffffffffffffe88->down);
  this_03 = (NoViableAltException *)(in_RDI + 6);
  (**(code **)(*in_RDI + 0x28))(local_58,in_RDI,1);
  ASTFactory::create(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->down);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe90);
  Parser::match(in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if ((iVar2 != 8) && (iVar2 != 0xc)) {
    if ((iVar2 != 0xd) && (((iVar2 != 0x11 && (iVar2 != 0x17)) && (2 < iVar2 - 0x3dU)))) {
      uVar4 = __cxa_allocate_exception(0x40);
      (**(code **)(*in_RDI + 0x28))(local_60,in_RDI,1);
      NoViableAltException::NoViableAltException
                (this_03,(RefToken *)CONCAT44(iVar2,in_stack_fffffffffffffef8));
      __cxa_throw(uVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
    attrItemList(in_stack_ffffffffffffff80);
    RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  iVar3 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (iVar3 == 8) {
    RefCount<AST>::RefCount(&in_stack_fffffffffffffe90->down,&in_stack_fffffffffffffe88->down);
    (**(code **)(*in_RDI + 0x28))(&stack0xffffffffffffff80,in_RDI,1);
    ASTFactory::create(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->down);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe90);
    Parser::match(in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->down);
  }
  else if (iVar3 != 0xc) {
    local_89 = 1;
    uVar4 = __cxa_allocate_exception(0x40);
    (**(code **)(*in_RDI + 0x28))(local_88,in_RDI,1);
    NoViableAltException::NoViableAltException
              (this_03,(RefToken *)CONCAT44(iVar2,in_stack_fffffffffffffef8));
    local_89 = 0;
    __cxa_throw(uVar4,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException);
  }
  RefCount<AST>::RefCount(&in_stack_fffffffffffffe90->down,&in_stack_fffffffffffffe88->down);
  nodes = (ASTArray *)(in_RDI + 6);
  (**(code **)(*in_RDI + 0x28))(local_a8,in_RDI,1);
  ASTFactory::create(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  iVar2 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->down);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffe90);
  Parser::match(in_stack_fffffffffffffec0,iVar2);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  this_02 = (ASTPair *)(in_RDI + 6);
  operator_new(0x20);
  ASTArray::ASTArray(in_stack_fffffffffffffea0,(int)((ulong)in_stack_fffffffffffffe98 >> 0x20));
  ASTFactory::create(in_stack_fffffffffffffed8,(int)((ulong)nodes >> 0x20));
  ASTArray::add((ASTArray *)in_stack_fffffffffffffe90,&in_stack_fffffffffffffe88->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffe90->down,&in_stack_fffffffffffffe88->down);
  ASTArray::add((ASTArray *)in_stack_fffffffffffffe90,&in_stack_fffffffffffffe88->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffe90->down,&in_stack_fffffffffffffe88->down);
  ASTArray::add((ASTArray *)in_stack_fffffffffffffe90,&in_stack_fffffffffffffe88->down);
  ASTFactory::make(in_stack_fffffffffffffed8,nodes);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->down);
  RefCount<AST>::operator=((RefCount<AST> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  bVar1 = false;
  this_00 = RefCount::operator_cast_to_AST_((RefCount *)local_20);
  other = RefCount::operator_cast_to_AST_((RefCount *)&nullAST);
  if (this_00 != other) {
    in_stack_fffffffffffffe90 = RefCount<AST>::operator->(local_20);
    AST::getFirstChild(in_stack_fffffffffffffe78);
    bVar1 = true;
    in_stack_fffffffffffffe88 = RefCount::operator_cast_to_AST_(local_d8);
    in_stack_fffffffffffffe80 = RefCount::operator_cast_to_AST_((RefCount *)&nullAST);
    if (in_stack_fffffffffffffe88 != in_stack_fffffffffffffe80) {
      this_01 = RefCount<AST>::operator->(local_20);
      AST::getFirstChild(this_01);
      goto LAB_0020f102;
    }
  }
  RefCount<AST>::RefCount(&in_stack_fffffffffffffe90->down,&in_stack_fffffffffffffe88->down);
LAB_0020f102:
  RefCount<AST>::operator=(&this_00->down,&other->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->down);
  if (bVar1) {
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->down);
  }
  ASTPair::advanceChildToEnd(this_02);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->down);
  RefCount<AST>::operator=(&this_00->down,&other->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe80->down);
  ASTPair::~ASTPair((ASTPair *)in_stack_fffffffffffffe80);
  return;
}

Assistant:

void GrpParser::attrItemStruct() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST attrItemStruct_AST = nullAST;
	RefAST I_AST = nullAST;
	RefAST X_AST = nullAST;
	
	try {      // for error handling
		{
		attrName();
		I_AST = returnAST;
		}
		RefAST tmp109_AST = nullAST;
		tmp109_AST = astFactory.create(LT(1));
		match(OP_LBRACE);
		{
		switch ( LA(1)) {
		case IDENT:
		case LIT_INT:
		case LITERAL_glyph:
		case LITERAL_justify:
		case LITERAL_min:
		case LITERAL_max:
		{
			attrItemList();
			X_AST = returnAST;
			break;
		}
		case OP_SEMI:
		case OP_RBRACE:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		{
		switch ( LA(1)) {
		case OP_SEMI:
		{
			RefAST tmp110_AST = nullAST;
			tmp110_AST = astFactory.create(LT(1));
			match(OP_SEMI);
			break;
		}
		case OP_RBRACE:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		RefAST tmp111_AST = nullAST;
		tmp111_AST = astFactory.create(LT(1));
		match(OP_RBRACE);
		attrItemStruct_AST = currentAST.root;
		attrItemStruct_AST = astFactory.make( (new ASTArray(3))->add(astFactory.create(ZdotStruct))->add(I_AST)->add(X_AST));
		currentAST.root = attrItemStruct_AST;
		currentAST.child = attrItemStruct_AST!=nullAST &&attrItemStruct_AST->getFirstChild()!=nullAST ?
			attrItemStruct_AST->getFirstChild() : attrItemStruct_AST;
		currentAST.advanceChildToEnd();
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_34);
	}
	returnAST = attrItemStruct_AST;
}